

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void kj::
     ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::_::CaptureForCoroutine<kj::(anonymous_namespace)::makeCheckThenDelayedIntegerFunctor(kj::Timer&,unsigned_long)::__0>>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::_::CaptureForCoroutine<kj::(anonymous_namespace)::makeCheckThenDelayedIntegerFunctor(kj::Timer&,unsigned_long)::__0>,void*&>
               (SimpleTransformPromiseNode<unsigned_long,_kj::_::CaptureForCoroutine<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_coroutine_test_c__:544:10)>_>
                *location,Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params,
               CaptureForCoroutine<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_coroutine_test_c__:544:10)>
               *params_1,void **params_2)

{
  size_t sVar1;
  byte bVar2;
  
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (&location->super_TransformPromiseNodeBase,params,*params_2);
  (location->super_TransformPromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
  _vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_0057fdf0;
  bVar2 = (params_1->maybeFunctor).ptr.isSet;
  (location->func).maybeFunctor.ptr.isSet = (bool)bVar2;
  if ((bool)bVar2 == true) {
    sVar1 = (params_1->maybeFunctor).ptr.field_1.value.i;
    (location->func).maybeFunctor.ptr.field_1.value.timer =
         (params_1->maybeFunctor).ptr.field_1.value.timer;
    (location->func).maybeFunctor.ptr.field_1.value.i = sVar1;
    bVar2 = (params_1->maybeFunctor).ptr.isSet;
  }
  if ((bVar2 & 1) != 0) {
    (params_1->maybeFunctor).ptr.isSet = false;
  }
  return;
}

Assistant:

inline void ctor(T& location, Params&&... params) {
  new (_::PlacementNew(), &location) T(kj::fwd<Params>(params)...);
}